

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O0

size_t duckdb::Linenoise::ComputeRenderWidth(char *buf,size_t len)

{
  int32_t iVar1;
  char *in_RSI;
  long in_RDI;
  size_t char_render_width;
  int sz;
  size_t render_width;
  size_t cpos;
  size_t in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  char *s;
  char *s_00;
  
  s_00 = (char *)0x0;
  s = (char *)0x0;
  while (s_00 < in_RSI) {
    iVar1 = Utf8Proc::UTF8ToCodepoint(s_00 + in_RDI,(int *)&stack0xffffffffffffffdc);
    if (iVar1 < 0) {
      s_00 = s_00 + 1;
      s = s + 1;
    }
    else {
      in_stack_ffffffffffffffd0 =
           Utf8Proc::RenderWidth(s,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      s_00 = (char *)Utf8Proc::NextGraphemeCluster(s_00,(size_t)s,in_stack_ffffffffffffffd8);
      s = s + in_stack_ffffffffffffffd0;
    }
  }
  return (size_t)s;
}

Assistant:

size_t Linenoise::ComputeRenderWidth(const char *buf, size_t len) {
	// utf8 in prompt, get render width
	size_t cpos = 0;
	size_t render_width = 0;
	int sz;
	while (cpos < len) {
		if (duckdb::Utf8Proc::UTF8ToCodepoint(buf + cpos, sz) < 0) {
			cpos++;
			render_width++;
			continue;
		}

		size_t char_render_width = duckdb::Utf8Proc::RenderWidth(buf, len, cpos);
		cpos = duckdb::Utf8Proc::NextGraphemeCluster(buf, len, cpos);
		render_width += char_render_width;
	}
	return render_width;
}